

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

Aig_Man_t * Aig_ManDupNodesAll(Aig_Man_t *p,Vec_Ptr_t *vSet)

{
  char *__s;
  void *pvVar1;
  uint uVar2;
  Aig_Man_t *p_00;
  size_t sVar3;
  char *__dest;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  Aig_Man_t *pAVar7;
  Aig_Obj_t *p1;
  int nRegs;
  long lVar8;
  int iVar9;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(__s);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      pAVar4 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      lVar8 = lVar8 + 1;
      pVVar5 = p->vCis;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e18e3;
        uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar4 = Aig_And(p_00,pAVar4,p1);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  if (0 < vSet->nSize) {
    lVar8 = 0;
    do {
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                           ((ulong)((uint)vSet->pArray[lVar8] & 1) ^
                           *(ulong *)(((ulong)vSet->pArray[lVar8] & 0xfffffffffffffffe) + 0x28)));
      lVar8 = lVar8 + 1;
    } while (lVar8 < vSet->nSize);
  }
  nRegs = p->nRegs;
  if (0 < nRegs) {
    iVar9 = 0;
    do {
      uVar2 = p->nTruePos + iVar9;
      if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p->vCos->pArray[uVar2];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_006e18e3:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar9 = iVar9 + 1;
      nRegs = p->nRegs;
    } while (iVar9 < nRegs);
  }
  Aig_ManSetRegNum(p_00,nRegs);
  Aig_ManSeqCleanup(p_00);
  pAVar7 = Aig_ManDupSimpleDfs(p_00);
  Aig_ManStop(p_00);
  return pAVar7;
}

Assistant:

Aig_Man_t * Aig_ManDupNodesAll( Aig_Man_t * p, Vec_Ptr_t * vSet )
{
    Aig_Man_t * pNew, * pCopy;
    Aig_Obj_t * pObj;
    int i;
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
//    Saig_ManForEachPo( p, pObj, i )
//        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSet, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_Regular(pObj)->pData, Aig_IsComplement(pObj)) );
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p) );
    // cleanup and return a copy
    Aig_ManSeqCleanup( pNew );
    pCopy = Aig_ManDupSimpleDfs( pNew );
    Aig_ManStop( pNew );
    return pCopy;
}